

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NumberZ.cpp
# Opt level: O2

void __thiscall OpenMD::NumberZ::writeNumberZ(NumberZ *this)

{
  double dVar1;
  int iVar2;
  double *pdVar3;
  double *pdVar4;
  pointer pdVar5;
  char cVar6;
  long lVar7;
  long lVar8;
  double *pdVar9;
  ostream *poVar10;
  uint uVar11;
  ulong uVar12;
  double dVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  double dVar16;
  double local_258;
  ofstream rdfStream;
  
  pdVar4 = (this->zBox_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  dVar13 = 0.0;
  pdVar3 = (this->zBox_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (pdVar9 = pdVar3; pdVar9 != pdVar4; pdVar9 = pdVar9 + 1) {
    dVar13 = dVar13 + *pdVar9;
  }
  lVar7 = (long)pdVar4 - (long)pdVar3;
  lVar8 = lVar7 >> 3;
  auVar14._8_4_ = (int)(lVar7 >> 0x23);
  auVar14._0_8_ = lVar8;
  auVar14._12_4_ = 0x45300000;
  pdVar3 = (this->areas_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar4 = (this->areas_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_258 = 0.0;
  for (pdVar9 = pdVar3; pdVar9 != pdVar4; pdVar9 = pdVar9 + 1) {
    local_258 = local_258 + *pdVar9;
  }
  std::ofstream::ofstream
            (&rdfStream,(this->super_StaticAnalyser).outputFilename_._M_dataplus._M_p,_S_out);
  cVar6 = std::__basic_file<char>::is_open();
  if (cVar6 == '\0') {
    snprintf(painCave.errMsg,2000,"NumberZ: unable to open %s\n",
             (this->super_StaticAnalyser).outputFilename_._M_dataplus._M_p);
    painCave.isFatal = 1;
    simError();
  }
  else {
    poVar10 = std::operator<<((ostream *)&rdfStream,"#NumberZ ");
    std::operator<<(poVar10,"\n");
    poVar10 = std::operator<<((ostream *)&rdfStream,"#selection: (");
    poVar10 = std::operator<<(poVar10,(string *)&this->selectionScript_);
    std::operator<<(poVar10,")\n");
    poVar10 = std::operator<<((ostream *)&rdfStream,"#");
    poVar10 = std::operator<<(poVar10,(string *)&this->axisLabel_);
    std::operator<<(poVar10,"\tnumber\n");
    dVar13 = dVar13 / ((auVar14._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)lVar8) - 4503599627370496.0));
    lVar7 = (long)pdVar4 - (long)pdVar3;
    lVar8 = lVar7 >> 3;
    auVar15._8_4_ = (int)(lVar7 >> 0x23);
    auVar15._0_8_ = lVar8;
    auVar15._12_4_ = 0x45300000;
    uVar11 = 0;
    while( true ) {
      uVar12 = (ulong)uVar11;
      pdVar5 = (this->numberZ_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((ulong)((long)(this->numberZ_).super__Vector_base<double,_std::allocator<double>_>._M_impl
                        .super__Vector_impl_data._M_finish - (long)pdVar5 >> 3) <= uVar12) break;
      dVar16 = (double)(this->super_StaticAnalyser).nBins_;
      dVar1 = pdVar5[uVar12];
      iVar2 = this->nProcessed_;
      poVar10 = std::ostream::_M_insert<double>((((double)uVar12 + 0.5) * dVar13) / dVar16);
      std::operator<<(poVar10,"\t");
      poVar10 = std::ostream::_M_insert<double>
                          (dVar1 / ((((local_258 /
                                      ((auVar15._8_8_ - 1.9342813113834067e+25) +
                                      ((double)CONCAT44(0x43300000,(int)lVar8) - 4503599627370496.0)
                                      )) * dVar13) / dVar16) * (double)iVar2));
      std::operator<<(poVar10,"\n");
      uVar11 = uVar11 + 1;
    }
  }
  std::ofstream::close();
  std::ofstream::~ofstream(&rdfStream);
  return;
}

Assistant:

void NumberZ::writeNumberZ() {
    // compute average box length:
    std::vector<RealType>::iterator j;
    RealType zSum = 0.0;
    for (j = zBox_.begin(); j != zBox_.end(); ++j) {
      zSum += *j;
    }
    RealType zAve = zSum / zBox_.size();

    RealType areaSum = 0.0;
    for (j = areas_.begin(); j != areas_.end(); ++j) {
      areaSum += *j;
    }
    RealType areaAve = areaSum / areas_.size();

    std::ofstream rdfStream(outputFilename_.c_str());
    if (rdfStream.is_open()) {
      rdfStream << "#NumberZ "
                << "\n";
      rdfStream << "#selection: (" << selectionScript_ << ")\n";
      rdfStream << "#" << axisLabel_ << "\tnumber\n";
      RealType binNumber;
      for (unsigned int i = 0; i < numberZ_.size(); ++i) {
        RealType z = zAve * (i + 0.5) / nBins_;

        RealType volSlice = areaAve * zAve / nBins_;

        binNumber = numberZ_[i] / (volSlice * nProcessed_);

        rdfStream << z << "\t" << binNumber << "\n";
      }

    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "NumberZ: unable to open %s\n", outputFilename_.c_str());
      painCave.isFatal = 1;
      simError();
    }

    rdfStream.close();
  }